

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void getKeyCode(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TypedAttribute<Imf_3_4::KeyCode> *this;
  invalid_argument *this_00;
  int iVar2;
  allocator<char> local_81;
  long *local_80;
  long local_78;
  long local_70 [2];
  SetAttr local_60;
  
  if (*i <= argc + -8) {
    this = (TypedAttribute<Imf_3_4::KeyCode> *)operator_new(0x28);
    Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::TypedAttribute(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,attrName,&local_81);
    paVar1 = &local_60.name.field_2;
    local_60.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_80,local_78 + (long)local_80);
    local_60.part = part;
    local_60.attr = (Attribute *)this;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.name._M_dataplus._M_p,local_60.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    iVar2 = (int)this + 8;
    strtol(argv[(long)*i + 1],(char **)0x0,0);
    Imf_3_4::KeyCode::setFilmMfcCode(iVar2);
    strtol(argv[(long)*i + 2],(char **)0x0,0);
    Imf_3_4::KeyCode::setFilmType(iVar2);
    strtol(argv[(long)*i + 3],(char **)0x0,0);
    Imf_3_4::KeyCode::setPrefix(iVar2);
    strtol(argv[(long)*i + 4],(char **)0x0,0);
    Imf_3_4::KeyCode::setCount(iVar2);
    strtol(argv[(long)*i + 5],(char **)0x0,0);
    Imf_3_4::KeyCode::setPerfOffset(iVar2);
    strtol(argv[(long)*i + 6],(char **)0x0,0);
    Imf_3_4::KeyCode::setPerfsPerFrame(iVar2);
    strtol(argv[(long)*i + 7],(char **)0x0,0);
    Imf_3_4::KeyCode::setPerfsPerCount(iVar2);
    *i = *i + 8;
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Expected a key code");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getKeyCode (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs)
{
    if (i > argc - 8) throw invalid_argument ("Expected a key code");

    KeyCodeAttribute* a = new KeyCodeAttribute;
    attrs.push_back (SetAttr (attrName, part, a));

    a->value ().setFilmMfcCode (strtol (argv[i + 1], 0, 0));
    a->value ().setFilmType (strtol (argv[i + 2], 0, 0));
    a->value ().setPrefix (strtol (argv[i + 3], 0, 0));
    a->value ().setCount (strtol (argv[i + 4], 0, 0));
    a->value ().setPerfOffset (strtol (argv[i + 5], 0, 0));
    a->value ().setPerfsPerFrame (strtol (argv[i + 6], 0, 0));
    a->value ().setPerfsPerCount (strtol (argv[i + 7], 0, 0));
    i += 8;
}